

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

QString * __thiscall
QMimeBinaryProvider::resolveAlias
          (QString *__return_storage_ptr__,QMimeBinaryProvider *this,QString *name)

{
  uint uVar1;
  uchar *puVar2;
  bool bVar3;
  DataPointer *pDVar4;
  int iVar5;
  QString *pQVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  char *str2;
  QString *this_00;
  uint uVar10;
  int iVar11;
  long in_FS_OFFSET;
  QByteArrayView ba;
  qsizetype local_80;
  char16_t *local_78;
  Data *local_70;
  QByteArray local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper(&local_68,name);
  puVar2 = ((this->m_cacheFile)._M_t.
            super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
            ._M_t.
            super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
            .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->data;
  uVar1 = *(uint *)(puVar2 + 4);
  uVar7 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(puVar2 + (int)uVar7);
  iVar9 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) - 1;
  local_70 = (__return_storage_ptr__->d).d;
  local_78 = (__return_storage_ptr__->d).ptr;
  local_80 = (__return_storage_ptr__->d).size;
  iVar11 = 0;
  do {
    if (iVar9 < iVar11) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      goto LAB_004ba5c1;
    }
    str2 = local_68.d.ptr;
    if (local_68.d.ptr == (char *)0x0) {
      str2 = "";
    }
    uVar10 = (uint)(iVar11 + iVar9) >> 1;
    puVar2 = ((this->m_cacheFile)._M_t.
              super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
              ._M_t.
              super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
              .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->data;
    lVar8 = (long)(int)(uVar7 + 4 + uVar10 * 8);
    uVar1 = *(uint *)(puVar2 + lVar8);
    iVar5 = qstrcmp((char *)(puVar2 + (int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                            (uVar1 & 0xff00) << 8 | uVar1 << 0x18)),str2);
    if (iVar5 < 0) {
      iVar11 = uVar10 + 1;
      bVar3 = true;
    }
    else if (iVar5 == 0) {
      puVar2 = ((this->m_cacheFile)._M_t.
                super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                ._M_t.
                super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->data;
      uVar1 = *(uint *)(puVar2 + lVar8 + 4);
      ba.m_data._0_4_ =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      ba.m_size = puVar2 + (int)(uint)ba.m_data;
      if (puVar2 == (uchar *)0x0) {
        this_00 = (QString *)0x0;
      }
      else {
        pQVar6 = (QString *)0xffffffffffffffff;
        do {
          this_00 = (QString *)((long)&(pQVar6->d).d + 1);
          pDVar4 = &pQVar6->d;
          pQVar6 = this_00;
        } while (*(uchar *)((long)&pDVar4->d + (long)(ba.m_size + 1)) != '\0');
      }
      ba.m_data._4_4_ = 0;
      QString::fromLatin1(&local_50,this_00,ba);
      local_70 = local_50.d.d;
      local_78 = local_50.d.ptr;
      local_80 = local_50.d.size;
      bVar3 = false;
    }
    else {
      iVar9 = uVar10 - 1;
      bVar3 = true;
    }
  } while (bVar3);
  (__return_storage_ptr__->d).ptr = local_78;
  (__return_storage_ptr__->d).size = local_80;
  (__return_storage_ptr__->d).d = local_70;
LAB_004ba5c1:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QMimeBinaryProvider::resolveAlias(const QString &name)
{
    const QByteArray input = name.toLatin1();
    const int aliasListOffset = m_cacheFile->getUint32(PosAliasListOffset);
    const int numEntries = m_cacheFile->getUint32(aliasListOffset);
    int begin = 0;
    int end = numEntries - 1;
    while (begin <= end) {
        const int medium = (begin + end) / 2;
        const int off = aliasListOffset + 4 + 8 * medium;
        const int aliasOffset = m_cacheFile->getUint32(off);
        const char *alias = m_cacheFile->getCharStar(aliasOffset);
        const int cmp = qstrcmp(alias, input);
        if (cmp < 0) {
            begin = medium + 1;
        } else if (cmp > 0) {
            end = medium - 1;
        } else {
            const int mimeOffset = m_cacheFile->getUint32(off + 4);
            const char *mimeType = m_cacheFile->getCharStar(mimeOffset);
            return QLatin1StringView(mimeType);
        }
    }
    return QString();
}